

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DACSThinker::Serialize(DACSThinker *this,FSerializer *arc)

{
  DLevelScript *pDVar1;
  bool bVar2;
  hash_t hVar3;
  uint uVar4;
  FSerializer *this_00;
  Node *pNVar5;
  ScriptMap *this_01;
  Pair *pair;
  Iterator it;
  SavingRunningscript srs;
  
  DObject::Serialize((DObject *)this,arc);
  this_00 = FSerializer::operator()(arc,"scripts",&this->Scripts);
  FSerializer::operator()(this_00,"lastscript",&this->LastScript);
  this_01 = &this->RunningScripts;
  if (arc->w == (FWriter *)0x0) {
    TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::Clear(this_01,1);
    bVar2 = FSerializer::BeginArray(arc,"runningscripts");
    if (!bVar2) {
      return;
    }
    uVar4 = FSerializer::ArraySize(arc);
    while (bVar2 = uVar4 != 0, uVar4 = uVar4 - 1, bVar2) {
      FSerializer::operator()(arc,(char *)0x0,(SavingRunningscript *)&it);
      pDVar1 = (DLevelScript *)CONCAT44(it._12_4_,it.Position);
      pNVar5 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::GetNode
                         (this_01,(int)it.Map);
      (pNVar5->Pair).Value = pDVar1;
    }
  }
  else {
    hVar3 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::CountUsed
                      (this_01);
    if (hVar3 == 0) {
      return;
    }
    it.Position = 0;
    it.Map = this_01;
    FSerializer::BeginArray(arc,"runningscripts");
    while (bVar2 = TMapIterator<int,_DLevelScript_*,_TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>_>
                   ::NextPair(&it,&pair), bVar2) {
      if (pair->Value == (DLevelScript *)0x0) {
        __assert_fail("pair->Value != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                      ,0xb74,"virtual void DACSThinker::Serialize(FSerializer &)");
      }
      srs.scriptnum = pair->Key;
      srs.lscript = pair->Value;
      FSerializer::operator()(arc,(char *)0x0,&srs);
    }
  }
  FSerializer::EndArray(arc);
  return;
}

Assistant:

void DACSThinker::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("scripts", Scripts)
		("lastscript", LastScript);

	if (arc.isWriting())
	{
		if (RunningScripts.CountUsed())
		{
			ScriptMap::Iterator it(RunningScripts);
			ScriptMap::Pair *pair;

			arc.BeginArray("runningscripts");
			while (it.NextPair(pair))
			{
				assert(pair->Value != nullptr);
				SavingRunningscript srs = { pair->Key, pair->Value };
				arc(nullptr, srs);
			}
			arc.EndArray();
		}
	}
	else // Loading
	{
		DLevelScript *script = nullptr;
		RunningScripts.Clear();
		if (arc.BeginArray("runningscripts"))
		{
			auto cnt = arc.ArraySize();
			for (unsigned i = 0; i < cnt; i++)
			{
				SavingRunningscript srs;
				arc(nullptr, srs);
				RunningScripts[srs.scriptnum] = srs.lscript;
			}
			arc.EndArray();
		}
	}
}